

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
          (WireFormatTest<proto2_unittest::TestAllTypes> *this,TestMessageSetExtension1 *message,
          CodedOutputStream *coded_output)

{
  undefined1 *puVar1;
  
  io::CodedOutputStream::WriteVarint32(coded_output,0x78);
  io::CodedOutputStream::WriteVarint64(coded_output,(long)(message->field_0)._impl_.i_);
  io::CodedOutputStream::WriteVarint32(coded_output,0x82);
  puVar1 = (undefined1 *)(message->field_0)._impl_.recursive_;
  if ((TestMessageSet *)puVar1 == (TestMessageSet *)0x0) {
    puVar1 = proto2_wireformat_unittest::_TestMessageSet_default_instance_;
  }
  io::CodedOutputStream::WriteVarint32
            (coded_output,(((TestMessageSet *)puVar1)->field_0)._impl_._cached_size_.atom_);
  puVar1 = (undefined1 *)(message->field_0)._impl_.recursive_;
  if ((TestMessageSet *)puVar1 == (TestMessageSet *)0x0) {
    puVar1 = proto2_wireformat_unittest::_TestMessageSet_default_instance_;
  }
  SerializeReverseOrder(this,(TestMessageSet *)puVar1,coded_output);
  return;
}

Assistant:

void SerializeReverseOrder(const TestMessageSetExtension1& message,
                             io::CodedOutputStream* coded_output) {
    WireFormatLite::WriteTag(15,  // i
                             WireFormatLite::WIRETYPE_VARINT, coded_output);
    coded_output->WriteVarint64(message.i());
    WireFormatLite::WriteTag(16,  // recursive
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                             coded_output);
    coded_output->WriteVarint32(message.recursive().GetCachedSize());
    SerializeReverseOrder(message.recursive(), coded_output);
  }